

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

PatchList re2::PatchList::Append(Inst *inst0,PatchList l1,PatchList l2)

{
  ulong uVar1;
  Inst *pIVar2;
  ulong uVar3;
  
  if (l1.p == 0) {
    return (PatchList)l2.p;
  }
  uVar3 = (ulong)l1.p;
  if (l2.p != 0) {
    do {
      while (uVar1 = uVar3 >> 1, (uVar3 & 1) == 0) {
        uVar3 = (ulong)(inst0[uVar1].out_opcode_ >> 4);
        if (inst0[uVar1].out_opcode_ < 0x10) {
          inst0[uVar1].out_opcode_ = inst0[uVar1].out_opcode_ & 0xf | l2.p << 4;
          return (PatchList)l1.p;
        }
      }
      uVar3 = (ulong)inst0[uVar1].field_1.out1_;
    } while (inst0[uVar1].field_1.out1_ != 0);
    pIVar2 = inst0 + uVar1;
    *(uint8_t *)&pIVar2->field_1 = (char)l2.p;
    *(char *)((long)&pIVar2->field_1 + 1) = (char)(l2.p >> 8);
    *(short *)((long)&pIVar2->field_1 + 2) = (short)(l2.p >> 0x10);
  }
  return (PatchList)l1.p;
}

Assistant:

PatchList PatchList::Append(Prog::Inst* inst0, PatchList l1, PatchList l2) {
  if (l1.p == 0)
    return l2;
  if (l2.p == 0)
    return l1;

  PatchList l = l1;
  for (;;) {
    PatchList next = PatchList::Deref(inst0, l);
    if (next.p == 0)
      break;
    l = next;
  }

  Prog::Inst* ip = &inst0[l.p>>1];
  if (l.p&1)
    ip->out1_ = l2.p;
  else
    ip->set_out(l2.p);

  return l1;
}